

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

bool __thiscall
QPDF::JSONReactor::setNextStateIfDictionary(JSONReactor *this,string *key,JSON *value,state_e next)

{
  bool bVar1;
  qpdf_offset_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = JSON::isDictionary(value);
  if (bVar1) {
    this->next_state = next;
  }
  else {
    offset = JSON::getStart(value);
    std::operator+(&local_50,"\"",key);
    std::operator+(&local_70,&local_50,"\" must be a dictionary");
    error(this,offset,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return bVar1;
}

Assistant:

bool
QPDF::JSONReactor::setNextStateIfDictionary(std::string const& key, JSON const& value, state_e next)
{
    // Use this method when the next state is for processing a nested dictionary.
    if (value.isDictionary()) {
        this->next_state = next;
        return true;
    }
    error(value.getStart(), "\"" + key + "\" must be a dictionary");
    return false;
}